

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btRaycastVehicle.cpp
# Opt level: O0

void __thiscall
btWheelContactPoint::btWheelContactPoint
          (btWheelContactPoint *this,btRigidBody *body0,btRigidBody *body1,
          btVector3 *frictionPosWorld,btVector3 *frictionDirectionWorld,btScalar maxImpulse)

{
  undefined8 *in_RCX;
  undefined8 in_RDX;
  undefined8 in_RSI;
  undefined8 *in_RDI;
  undefined8 *in_R8;
  undefined4 in_XMM0_Da;
  btScalar bVar1;
  btScalar bVar2;
  btScalar relaxation;
  btScalar denom1;
  btScalar denom0;
  
  *in_RDI = in_RSI;
  in_RDI[1] = in_RDX;
  in_RDI[2] = *in_RCX;
  in_RDI[3] = in_RCX[1];
  in_RDI[4] = *in_R8;
  in_RDI[5] = in_R8[1];
  *(undefined4 *)((long)in_RDI + 0x34) = in_XMM0_Da;
  bVar1 = btRigidBody::computeImpulseDenominator
                    ((btRigidBody *)frictionDirectionWorld,(btVector3 *)CONCAT44(maxImpulse,denom0),
                     _relaxation);
  bVar2 = btRigidBody::computeImpulseDenominator
                    ((btRigidBody *)frictionDirectionWorld,(btVector3 *)CONCAT44(maxImpulse,denom0),
                     _relaxation);
  *(float *)(in_RDI + 6) = 1.0 / (bVar1 + bVar2);
  return;
}

Assistant:

btWheelContactPoint(btRigidBody* body0,btRigidBody* body1,const btVector3& frictionPosWorld,const btVector3& frictionDirectionWorld, btScalar maxImpulse)
		:m_body0(body0),
		m_body1(body1),
		m_frictionPositionWorld(frictionPosWorld),
		m_frictionDirectionWorld(frictionDirectionWorld),
		m_maxImpulse(maxImpulse)
	{
		btScalar denom0 = body0->computeImpulseDenominator(frictionPosWorld,frictionDirectionWorld);
		btScalar denom1 = body1->computeImpulseDenominator(frictionPosWorld,frictionDirectionWorld);
		btScalar	relaxation = 1.f;
		m_jacDiagABInv = relaxation/(denom0+denom1);
	}